

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O3

bool __thiscall
libtorrent::dht::dht_tracker::send_packet
          (dht_tracker *this,listen_socket_handle *s,entry *e,endpoint *addr)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  entry *this_00;
  _Base_ptr p_Var4;
  int64_t value;
  int c;
  counters *this_01;
  string_view key;
  error_code ec;
  bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void> local_81;
  error_code local_80;
  data_union local_70;
  string_type local_50;
  
  local_50.field_2._M_allocated_capacity._0_4_ = 0x1002544c;
  local_50._M_string_length = 4;
  local_50.field_2._M_allocated_capacity._4_4_ =
       local_50.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  key._M_str = "v";
  key._M_len = 1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  this_00 = entry::operator[](e,key);
  entry::operator=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                             local_50.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_70._0_8_ = &this->m_send_buf;
  pcVar2 = (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar2) {
    (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar2;
  }
  local_80._0_8_ = &local_70;
  ::std::
  visit<libtorrent::aux::bencode_visitor<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
            ((bencode_visitor<std::back_insert_iterator<std::vector<char,_std::allocator<char>_>_>_>
              *)&local_80,&e->super_variant_type);
  this->m_send_quota =
       this->m_send_quota +
       (*(int *)&(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start -
       *(int *)&(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish);
  local_80._0_8_ = local_80._0_8_ & 0xffffff0000000000;
  local_80.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  aux::listen_socket_handle::get_local_endpoint((endpoint *)&local_70.base,s);
  if (((addr->impl_).data_.base.sa_family == 2) == (local_70.base.sa_family != 2)) {
    p_Var4 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        aux::listen_socket_handle::get_local_endpoint
                  ((endpoint *)&local_70.base,(listen_socket_handle *)(p_Var4 + 1));
        if (((addr->impl_).data_.base.sa_family == 2) != (local_70.base.sa_family != 2)) break;
        p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    if ((_Rb_tree_header *)p_Var4 == p_Var1) {
      local_80.val_ = 0x61;
      local_80.failed_ = true;
      local_80._5_3_ = 0;
      local_80.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      goto LAB_003ae163;
    }
    local_70._0_8_ =
         (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_70.v4.sin_zero =
         (uchar  [8])
         ((long)(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - local_70._0_8_);
    if ((this->m_send_fun).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_003ae220;
    s = (listen_socket_handle *)(p_Var4 + 1);
  }
  else {
    local_70._0_8_ =
         (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_70.v4.sin_zero =
         (uchar  [8])
         ((long)(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - local_70._0_8_);
    if ((this->m_send_fun).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_003ae220:
      local_81.m_val = '\0';
      ::std::__throw_bad_function_call();
    }
  }
  local_81.m_val = '\0';
  (*(this->m_send_fun)._M_invoker)
            ((_Any_data *)&this->m_send_fun,s,addr,(span<const_char> *)&local_70.base,&local_80,
             &local_81);
LAB_003ae163:
  bVar3 = local_80.failed_;
  this_01 = this->m_counters;
  if (local_80.failed_ == true) {
    c = 0x8c;
  }
  else {
    counters::inc_stats_counter
              (this_01,0x8e,
               (long)(*(int *)&(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
    value = 0x30;
    if ((addr->impl_).data_.base.sa_family == 2) {
      value = 0x1c;
    }
    counters::inc_stats_counter(this->m_counters,0x81,value);
    this_01 = this->m_counters;
    c = 0x8b;
  }
  counters::inc_stats_counter(this_01,c,1);
  pcVar2 = (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*(this->m_log->super_dht_logger)._vptr_dht_logger[2])
            (this->m_log,1,pcVar2,
             (long)(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar2,addr);
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool dht_tracker::send_packet(aux::listen_socket_handle const& s, entry& e, udp::endpoint const& addr)
	{
		TORRENT_ASSERT(m_nodes.find(s) != m_nodes.end());

		static_assert(lt::version_minor < 16, "version number not supported by DHT");
		static_assert(lt::version_tiny < 16, "version number not supported by DHT");
		static char const ver[] = {'L', 'T'
			, lt::version_major, (lt::version_minor << 4) | lt::version_tiny};
		e["v"] = std::string(ver, ver+ 4);

		m_send_buf.clear();
		bencode(std::back_inserter(m_send_buf), e);

		// update the quota. We won't prevent the packet to be sent if we exceed
		// the quota, we'll just (potentially) block the next incoming request.

		m_send_quota -= int(m_send_buf.size());

		error_code ec;
		if (s.get_local_endpoint().protocol().family() != addr.protocol().family())
		{
			// the node is trying to send a packet to a different address family
			// than its socket, this can happen during bootstrap
			// pick a node with the right address family and use its socket
			auto n = std::find_if(m_nodes.begin(), m_nodes.end()
				, [&](tracker_nodes_t::value_type const& v)
					{ return v.first.get_local_endpoint().protocol().family() == addr.protocol().family(); });

			if (n != m_nodes.end())
				m_send_fun(n->first, addr, m_send_buf, ec, {});
			else
				ec = boost::asio::error::address_family_not_supported;
		}
		else
		{
			m_send_fun(s, addr, m_send_buf, ec, {});
		}

		if (ec)
		{
			m_counters.inc_stats_counter(counters::dht_messages_out_dropped);
#ifndef TORRENT_DISABLE_LOGGING
			m_log->log_packet(dht_logger::outgoing_message, m_send_buf, addr);
#endif
			return false;
		}

		m_counters.inc_stats_counter(counters::dht_bytes_out, int(m_send_buf.size()));
		// account for IP and UDP overhead
		m_counters.inc_stats_counter(counters::sent_ip_overhead_bytes
			, aux::is_v6(addr) ? 48 : 28);
		m_counters.inc_stats_counter(counters::dht_messages_out);
#ifndef TORRENT_DISABLE_LOGGING
		m_log->log_packet(dht_logger::outgoing_message, m_send_buf, addr);
#endif
		return true;
	}